

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpServer.cpp
# Opt level: O2

void __thiscall sznet::net::KcpWithTcpServer::~KcpWithTcpServer(KcpWithTcpServer *this)

{
  EventLoop *this_00;
  self *psVar1;
  _Base_ptr p_Var2;
  SourceFile file;
  undefined1 local_1060 [4048];
  Functor local_90;
  undefined1 local_70 [12];
  undefined1 local_60 [8];
  TcpConnectionPtr conn;
  
  EventLoop::assertInLoopThread(&this->m_loop->super_EventLoop);
  if (g_logLevel < 1) {
    Logger::SourceFile::SourceFile<107>
              ((SourceFile *)local_70,
               (char (*) [107])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpWithTcpServer.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_70._0_8_;
    file.m_size = local_70._8_4_;
    Logger::Logger((Logger *)local_1060,file,0x21,TRACE,"~KcpWithTcpServer");
    psVar1 = LogStream::operator<<
                       ((LogStream *)(local_1060 + 8),"KcpWithTcpServer::~KcpWithTcpServer [");
    psVar1 = LogStream::operator<<(psVar1,&this->m_name);
    LogStream::operator<<(psVar1,"] destructing");
    Logger::~Logger((Logger *)local_1060);
  }
  for (p_Var2 = (this->m_connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_connections)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
    std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)local_60,
               (__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var2[1]._M_parent);
    std::__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
               &p_Var2[1]._M_parent);
    this_00 = *(EventLoop **)((long)local_60 + 0x10);
    conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)TcpConnection::connectDestroyed;
    std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>::
    _Bind<std::shared_ptr<sznet::net::TcpConnection>&>
              ((_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                *)local_1060,
               (offset_in_TcpConnection_to_subr *)
               &conn.super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,(shared_ptr<sznet::net::TcpConnection> *)local_60);
    std::function<void()>::
    function<std::_Bind<void(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>,void>
              ((function<void()> *)&local_90,
               (_Bind<void_(sznet::net::TcpConnection::*(std::shared_ptr<sznet::net::TcpConnection>))()>
                *)local_1060);
    EventLoop::runInLoop(this_00,&local_90);
    std::_Function_base::~_Function_base(&local_90.super__Function_base);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1060 + 0x18));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&conn);
  }
  std::_Function_base::~_Function_base((_Function_base *)&this->m_tcpCodec);
  std::_Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>::
  ~_Vector_base(&(this->m_udpListenAddrs).
                 super__Vector_base<sznet::net::InetAddress,_std::allocator<sznet::net::InetAddress>_>
               );
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
  ::~_Rb_tree(&(this->m_connections)._M_t);
  std::_Function_base::~_Function_base(&(this->m_threadInitCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_kcpWriteCompleteCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_kcpMessageCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->m_kcpConnectionCallback).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_threadPool).
              super___shared_ptr<sznet::net::KcpTcpEventLoopThreadPool,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::unique_ptr<sznet::net::Acceptor,_std::default_delete<sznet::net::Acceptor>_>::~unique_ptr
            (&this->m_acceptor);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__cxx11::string::~string((string *)&this->m_ipPort);
  return;
}

Assistant:

KcpWithTcpServer::~KcpWithTcpServer()
{
	m_loop->assertInLoopThread();
	LOG_TRACE << "KcpWithTcpServer::~KcpWithTcpServer [" << m_name << "] destructing";

	for (auto& item : m_connections)
	{
		TcpConnectionPtr conn(item.second);
		item.second.reset();
		conn->getLoop()->runInLoop(std::bind(&TcpConnection::connectDestroyed, conn));
	}
}